

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_csp_enc.c
# Opt level: O0

void InitGammaTables_body(void)

{
  double dVar1;
  double norm;
  double scale;
  int v;
  int local_4;
  
  if (kGammaTablesOk == 0) {
    for (local_4 = 0; local_4 < 0x100; local_4 = local_4 + 1) {
      dVar1 = pow((double)local_4 * 0.00392156862745098,0.8);
      kGammaToLinearTab[local_4] = (uint16_t)(int)(dVar1 * 4095.0 + 0.5);
    }
    for (local_4 = 0; local_4 < 0x21; local_4 = local_4 + 1) {
      dVar1 = pow((double)local_4 * 0.03125763125763126,1.25);
      kLinearToGammaTab[local_4] = (int)(dVar1 * 255.0 + 0.5);
    }
    kGammaTablesOk = 1;
  }
  return;
}

Assistant:

WEBP_DSP_INIT_FUNC(InitGammaTables) {
  if (!kGammaTablesOk) {
    int v;
    const double scale = (double)(1 << GAMMA_TAB_FIX) / kGammaScale;
    const double norm = 1. / 255.;
    for (v = 0; v <= 255; ++v) {
      kGammaToLinearTab[v] =
          (uint16_t)(pow(norm * v, kGamma) * kGammaScale + .5);
    }
    for (v = 0; v <= GAMMA_TAB_SIZE; ++v) {
      kLinearToGammaTab[v] = (int)(255. * pow(scale * v, 1. / kGamma) + .5);
    }
    kGammaTablesOk = 1;
  }
}